

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O0

uint8_t * HexStringToBytes(char *hexstring,size_t expected_length)

{
  long lVar1;
  uint8_t *puVar2;
  size_t in_RSI;
  char *in_RDI;
  bool bVar3;
  char val [3];
  char *end;
  uint8_t *dst;
  uint8_t *raw_data;
  size_t actual_length;
  char *src;
  char local_43;
  char local_42;
  char local_41;
  char *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  ulong local_28;
  char *local_20;
  size_t local_18;
  uint8_t *local_8;
  
  local_28 = 0;
  local_20 = in_RDI;
  local_18 = in_RSI;
  local_38 = (uint8_t *)malloc(in_RSI);
  local_30 = local_38;
  if (local_38 == (uint8_t *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (local_28 < local_18) {
        bVar3 = *local_20 != '\0';
      }
      if (!bVar3) break;
      if (*local_20 != '\n') {
        local_43 = *local_20;
        local_42 = local_20[1];
        local_41 = '\0';
        local_20 = local_20 + 1;
        lVar1 = strtol(&local_43,&local_40,0x10);
        puVar2 = local_38 + 1;
        *local_38 = (uint8_t)lVar1;
        local_38 = puVar2;
        if (local_40 != &local_41) break;
        local_28 = local_28 + 1;
      }
      local_20 = local_20 + 1;
    }
    if (local_28 == local_18) {
      local_8 = local_30;
    }
    else {
      free(local_30);
      local_8 = (uint8_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

static uint8_t* HexStringToBytes(const char* hexstring,
                                 size_t expected_length) {
  const char* src = hexstring;
  size_t actual_length = 0;
  uint8_t* const raw_data = (uint8_t*)malloc(expected_length);
  uint8_t* dst;

  if (raw_data == NULL) return NULL;

  for (dst = raw_data; actual_length < expected_length && *src != '\0'; ++src) {
    char* end;
    char val[3];
    if (*src == '\n') continue;
    val[0] = *src++;
    val[1] = *src;
    val[2] = '\0';
    *dst++ = (uint8_t)strtol(val, &end, 16);
    if (end != val + 2) break;
    ++actual_length;
  }

  if (actual_length != expected_length) {
    free(raw_data);
    return NULL;
  }
  return raw_data;
}